

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_helper_mffscrn(DisasContext_conflict10 *ctx,TCGv_i64 t1)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t regno;
  TCGv_i64 ret;
  TCGv_i32 arg3;
  TCGv_i32 mask;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 t1_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  arg3 = tcg_const_i32_ppc64(tcg_ctx_00,1);
  gen_reset_fpstatus(tcg_ctx_00);
  tcg_gen_mov_i64_ppc64(tcg_ctx_00,ret,cpu_fpscr);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,0x7000000fb);
  regno = rD(ctx->opcode);
  set_fpr(tcg_ctx_00,regno,ret);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,ret,-4);
  tcg_gen_or_i64_ppc64(tcg_ctx_00,ret,ret,t1);
  gen_helper_store_fpscr(tcg_ctx_00,tcg_ctx_00->cpu_env,ret,arg3);
  tcg_temp_free_i32(tcg_ctx_00,arg3);
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_helper_mffscrn(DisasContext *ctx, TCGv_i64 t1)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i32 mask = tcg_const_i32(tcg_ctx, 0x0001);

    gen_reset_fpstatus(tcg_ctx);
    tcg_gen_extu_tl_i64(tcg_ctx, t0, cpu_fpscr);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, FP_DRN | FP_ENABLES | FP_RN);
    set_fpr(tcg_ctx, rD(ctx->opcode), t0);

    /* Mask FPSCR value to clear RN.  */
    tcg_gen_andi_i64(tcg_ctx, t0, t0, ~FP_RN);

    /* Merge RN into FPSCR value.  */
    tcg_gen_or_i64(tcg_ctx, t0, t0, t1);

    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t0, mask);

    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i64(tcg_ctx, t0);
}